

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_queue.c
# Opt level: O0

ItemQueue * ItemQueue_new_array(int size)

{
  ItemQueue *pIVar1;
  int local_1c;
  int i;
  ItemQueue *item_queues;
  int size_local;
  
  pIVar1 = (ItemQueue *)malloc((long)size << 4);
  for (local_1c = 0; local_1c < size; local_1c = local_1c + 1) {
    pIVar1[local_1c].first = (QueueItem *)0x0;
    pIVar1[local_1c].last = (QueueItem *)0x0;
  }
  return pIVar1;
}

Assistant:

ItemQueue* ItemQueue_new_array(int size) {
    ItemQueue* item_queues = (ItemQueue*)malloc(size * sizeof(ItemQueue));
    int i;
    for (i = 0; i < size; ++i) {
        item_queues[i].first = 0;
        item_queues[i].last = 0;
    }
    return item_queues;
}